

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPacket.cpp
# Opt level: O3

void __thiscall SNMPPacket::~SNMPPacket(SNMPPacket *this)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  this->_vptr_SNMPPacket = (_func_int **)&PTR__SNMPPacket_001a17d0;
  if (this->packet != (ComplexType *)0x0) {
    (*(this->packet->super_BER_CONTAINER)._vptr_BER_CONTAINER[1])();
  }
  std::deque<VarBind,_std::allocator<VarBind>_>::~deque(&this->varbindList);
  pcVar1 = (this->communityString)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->communityString).field_2) {
    operator_delete(pcVar1);
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (this->communityStringPtr).super___shared_ptr<OctetType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (this->snmpVersionPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (this->requestIDPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    return;
  }
  return;
}

Assistant:

SNMPPacket::~SNMPPacket(){
    delete this->packet;
}